

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_crypt.cc
# Opt level: O1

int RSA_padding_check_PKCS1_OAEP_mgf1
              (uint8_t *out,size_t *out_len,size_t max_out,uint8_t *from,size_t from_len,
              uint8_t *param,size_t param_len,EVP_MD *md,EVP_MD *mgf1md)

{
  int iVar1;
  undefined4 extraout_var;
  uchar *mask;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  size_t i;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong size;
  uint8_t seed [64];
  uint8_t phash [64];
  byte local_b8 [64];
  uchar local_78 [72];
  
  if (md == (EVP_MD *)0x0) {
    md = (EVP_MD *)EVP_sha1();
  }
  if (mgf1md == (EVP_MD *)0x0) {
    mgf1md = md;
  }
  iVar1 = EVP_MD_size((EVP_MD *)md);
  uVar6 = CONCAT44(extraout_var,iVar1);
  if (from_len < uVar6 * 2 + 2) {
    iVar5 = 2;
    mask = (uchar *)0x0;
  }
  else {
    size = ~uVar6 + from_len;
    mask = (uchar *)OPENSSL_malloc(size);
    if (mask != (uchar *)0x0) {
      iVar1 = PKCS1_MGF1(local_b8,uVar6,from + uVar6 + 1,size,(EVP_MD *)mgf1md);
      iVar5 = 3;
      if (iVar1 != 0) {
        if (uVar6 != 0) {
          uVar2 = 0;
          do {
            local_b8[uVar2] = local_b8[uVar2] ^ from[uVar2 + 1];
            uVar2 = uVar2 + 1;
          } while (uVar6 != uVar2);
        }
        iVar1 = PKCS1_MGF1(mask,size,local_b8,uVar6,(EVP_MD *)mgf1md);
        if (iVar1 != 0) {
          if (size != 0) {
            uVar2 = 0;
            do {
              mask[uVar2] = mask[uVar2] ^ (from + uVar6 + 1)[uVar2];
              uVar2 = uVar2 + 1;
            } while (size != uVar2);
          }
          iVar1 = EVP_Digest(param,param_len,local_78,(uint *)0x0,(EVP_MD *)md,(ENGINE *)0x0);
          iVar5 = 3;
          if (iVar1 != 0) {
            iVar1 = CRYPTO_memcmp(mask,local_78,uVar6);
            uVar2 = (long)(-(long)iVar1 | (long)iVar1 | -(ulong)*from) >> 0x3f;
            if (uVar6 < size) {
              lVar4 = ~(uVar6 * 2) + from_len;
              uVar8 = 0xffffffffffffffff;
              uVar3 = 0;
              do {
                uVar9 = (ulong)mask[uVar6];
                uVar7 = (long)((uVar9 ^ 1) - 1) >> 0x3f;
                uVar3 = (uVar6 ^ uVar3) & uVar7 & uVar8 ^ uVar3;
                uVar8 = ~uVar7 & uVar8;
                if (uVar9 != 0) {
                  uVar9 = uVar8;
                }
                uVar2 = uVar2 | uVar9;
                uVar6 = uVar6 + 1;
                lVar4 = lVar4 + -1;
              } while (lVar4 != 0);
            }
            else {
              uVar8 = 0xffffffffffffffff;
              uVar3 = 0;
            }
            iVar5 = 2;
            if (uVar2 == 0 && uVar8 == 0) {
              uVar3 = uVar3 + 1;
              uVar6 = size - uVar3;
              if (max_out < uVar6) {
                ERR_put_error(4,0,0x71,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rsa/rsa_crypt.cc"
                              ,0xc9);
                iVar5 = 3;
              }
              else {
                if (size != uVar3) {
                  memcpy(out,mask + uVar3,uVar6);
                }
                *out_len = uVar6;
                OPENSSL_free(mask);
                iVar5 = 1;
              }
            }
          }
        }
        goto LAB_001c6f35;
      }
    }
    iVar5 = 3;
  }
LAB_001c6f35:
  if (iVar5 != 3) {
    if (iVar5 != 2) {
      return 1;
    }
    ERR_put_error(4,0,0x85,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rsa/rsa_crypt.cc"
                  ,0xd6);
  }
  OPENSSL_free(mask);
  return 0;
}

Assistant:

int RSA_padding_check_PKCS1_OAEP_mgf1(uint8_t *out, size_t *out_len,
                                      size_t max_out, const uint8_t *from,
                                      size_t from_len, const uint8_t *param,
                                      size_t param_len, const EVP_MD *md,
                                      const EVP_MD *mgf1md) {
  uint8_t *db = NULL;

  {
    if (md == NULL) {
      md = EVP_sha1();
    }
    if (mgf1md == NULL) {
      mgf1md = md;
    }

    size_t mdlen = EVP_MD_size(md);

    // The encoded message is one byte smaller than the modulus to ensure that
    // it doesn't end up greater than the modulus. Thus there's an extra "+1"
    // here compared to https://tools.ietf.org/html/rfc2437#section-9.1.1.2.
    if (from_len < 1 + 2 * mdlen + 1) {
      // 'from_len' is the length of the modulus, i.e. does not depend on the
      // particular ciphertext.
      goto decoding_err;
    }

    size_t dblen = from_len - mdlen - 1;
    db = reinterpret_cast<uint8_t *>(OPENSSL_malloc(dblen));
    if (db == NULL) {
      goto err;
    }

    const uint8_t *maskedseed = from + 1;
    const uint8_t *maskeddb = from + 1 + mdlen;

    uint8_t seed[EVP_MAX_MD_SIZE];
    if (!PKCS1_MGF1(seed, mdlen, maskeddb, dblen, mgf1md)) {
      goto err;
    }
    for (size_t i = 0; i < mdlen; i++) {
      seed[i] ^= maskedseed[i];
    }

    if (!PKCS1_MGF1(db, dblen, seed, mdlen, mgf1md)) {
      goto err;
    }
    for (size_t i = 0; i < dblen; i++) {
      db[i] ^= maskeddb[i];
    }

    uint8_t phash[EVP_MAX_MD_SIZE];
    if (!EVP_Digest(param, param_len, phash, NULL, md, NULL)) {
      goto err;
    }

    crypto_word_t bad =
        ~constant_time_is_zero_w(CRYPTO_memcmp(db, phash, mdlen));
    bad |= ~constant_time_is_zero_w(from[0]);

    crypto_word_t looking_for_one_byte = CONSTTIME_TRUE_W;
    size_t one_index = 0;
    for (size_t i = mdlen; i < dblen; i++) {
      crypto_word_t equals1 = constant_time_eq_w(db[i], 1);
      crypto_word_t equals0 = constant_time_eq_w(db[i], 0);
      one_index =
          constant_time_select_w(looking_for_one_byte & equals1, i, one_index);
      looking_for_one_byte =
          constant_time_select_w(equals1, 0, looking_for_one_byte);
      bad |= looking_for_one_byte & ~equals0;
    }

    bad |= looking_for_one_byte;

    // Whether the overall padding was valid or not in OAEP is public.
    if (constant_time_declassify_w(bad)) {
      goto decoding_err;
    }

    // Once the padding is known to be valid, the output length is also public.
    static_assert(sizeof(size_t) <= sizeof(crypto_word_t),
                  "size_t does not fit in crypto_word_t");
    one_index = constant_time_declassify_w(one_index);

    one_index++;
    size_t mlen = dblen - one_index;
    if (max_out < mlen) {
      OPENSSL_PUT_ERROR(RSA, RSA_R_DATA_TOO_LARGE);
      goto err;
    }

    OPENSSL_memcpy(out, db + one_index, mlen);
    *out_len = mlen;
    OPENSSL_free(db);
    return 1;
  }

decoding_err:
  // To avoid chosen ciphertext attacks, the error message should not reveal
  // which kind of decoding error happened.
  OPENSSL_PUT_ERROR(RSA, RSA_R_OAEP_DECODING_ERROR);
err:
  OPENSSL_free(db);
  return 0;
}